

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O1

_Bool parse_PRG_rom(uint8_t *rom_data)

{
  uint8_t *puVar1;
  _Bool _Var2;
  uint8_t **ppuVar3;
  uint8_t *puVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar5 = (ulong)(uint)parsed_header.PRG_ROM_chunks;
  ppuVar3 = (uint8_t **)malloc((ulong)((uint)parsed_header.PRG_ROM_chunks * 8));
  PRG_rom_banks = ppuVar3;
  if (ppuVar3 == (uint8_t **)0x0) {
    puts("ERROR: Failed to malloc pointers for PRG_ROM banks");
    _Var2 = true;
  }
  else {
    bVar8 = uVar5 != 0;
    if (bVar8) {
      puVar4 = (uint8_t *)malloc(0x4000);
      *ppuVar3 = puVar4;
      if (puVar4 != (uint8_t *)0x0) {
        uVar7 = 0;
        do {
          if (uVar5 - 1 == uVar7) goto LAB_0010d1c0;
          puVar4 = (uint8_t *)malloc(0x4000);
          ppuVar3[uVar7 + 1] = puVar4;
          uVar7 = uVar7 + 1;
        } while (puVar4 != (uint8_t *)0x0);
        bVar8 = uVar7 < uVar5;
      }
      puts("ERROR: Failed to malloc space for PRG_ROM bank");
      if (bVar8) {
        return true;
      }
    }
LAB_0010d1c0:
    ppuVar3 = PRG_rom_banks;
    uVar5 = (ulong)parsed_header.PRG_ROM_chunks;
    if (uVar5 != 0) {
      puVar4 = rom_data + 0x10;
      uVar7 = 0;
      do {
        puVar1 = ppuVar3[uVar7];
        lVar6 = 0;
        do {
          puVar1[lVar6] = puVar4[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x4000);
        uVar7 = uVar7 + 1;
        puVar4 = puVar4 + 0x4000;
      } while (uVar7 != uVar5);
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool parse_PRG_rom(uint8_t* rom_data) {
    PRG_rom_banks = malloc(parsed_header.PRG_ROM_chunks * sizeof(uint8_t*));
    if(PRG_rom_banks == NULL) {
        printf("ERROR: Failed to malloc pointers for PRG_ROM banks\n");
        return true;
    }

    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        PRG_rom_banks[bank_num] = malloc(PRG_BANK_SIZE * sizeof(uint8_t));
        if(PRG_rom_banks[bank_num] == NULL) {
            printf("ERROR: Failed to malloc space for PRG_ROM bank\n");
            return true;
        }
    }

    uint32_t bank_starting_rom_address;
    uint32_t bank_ending_rom_address;
    uint8_t* bank_to_fill;
    uint16_t bank_address;
    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        bank_starting_rom_address = GAME_DATA_START + (PRG_BANK_SIZE * bank_num);
        bank_ending_rom_address   = GAME_DATA_START + (PRG_BANK_SIZE * (bank_num + 1));
        bank_to_fill              = PRG_rom_banks[bank_num];
        bank_address              = 0;

        for(uint32_t rom_address = bank_starting_rom_address; rom_address < bank_ending_rom_address; rom_address++) {
            bank_to_fill[bank_address++] = rom_data[rom_address];
        }
    }

    return false;
}